

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O2

void al_flush_event_queue(ALLEGRO_EVENT_QUEUE *queue)

{
  ALLEGRO_EVENT *event;
  ulong uVar1;
  uint idx;
  
  heartbeat();
  _al_mutex_lock(&queue->mutex);
  uVar1 = (ulong)queue->events_tail;
  while (idx = (uint)uVar1, idx != queue->events_head) {
    event = (ALLEGRO_EVENT *)_al_vector_ref(&queue->events,idx);
    unref_if_user_event(event);
    uVar1 = (ulong)(idx + 1) % (queue->events)._size;
  }
  queue->events_head = 0;
  queue->events_tail = 0;
  _al_mutex_unlock(&queue->mutex);
  return;
}

Assistant:

void al_flush_event_queue(ALLEGRO_EVENT_QUEUE *queue)
{
   unsigned int i;
   ASSERT(queue);

   heartbeat();

   _al_mutex_lock(&queue->mutex);

   /* Decrement reference counts on all user events. */
   i = queue->events_tail;
   while (i != queue->events_head) {
      ALLEGRO_EVENT *old_ev = _al_vector_ref(&queue->events, i);
      unref_if_user_event(old_ev);
      i = circ_array_next(&queue->events, i);
   }

   queue->events_head = queue->events_tail = 0;
   _al_mutex_unlock(&queue->mutex);
}